

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::exprNotTest(Parser *this)

{
  bool bVar1;
  ExprNode *comparison;
  ExprNode *notTest;
  undefined1 local_88 [8];
  Token notOp;
  Parser *this_local;
  
  notOp._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  bVar1 = Token::isNot((Token *)local_88);
  if (bVar1) {
    this_local = (Parser *)exprNotTest(this);
  }
  else {
    this_local = (Parser *)compareExpr(this);
  }
  Token::~Token((Token *)local_88);
  return (ExprNode *)this_local;
}

Assistant:

ExprNode *Parser::exprNotTest(){
    Token notOp = tokenizer.getToken();
    tokenizer.ungetToken();
    if(notOp.isNot()){
        ExprNode *notTest = exprNotTest();
        return notTest;
    }else {
        ExprNode *comparison = compareExpr();
        return comparison;
    }
}